

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
duckdb_fmt::v6::internal::float_writer<char>::prettify<char*>(float_writer<char> *this,char *it)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  int num_zeros;
  byte *__s;
  byte *pbVar8;
  char *pcVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  size_t __len;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  int i;
  int iVar18;
  
  iVar18 = this->num_digits_;
  uVar4 = *(uint *)&(this->specs_).field_0x4;
  uVar13 = this->exp_ + iVar18;
  if ((char)uVar4 == '\x01') {
    *it = *this->digits_;
    iVar18 = this->num_digits_;
    uVar4 = (this->specs_).precision - iVar18;
    bVar10 = (byte)((uint)*(undefined4 *)&(this->specs_).field_0x4 >> 0x1d) & 1 & 0 < (int)uVar4;
    if ((iVar18 < 2) && (bVar10 == 0)) {
      __s = (byte *)(it + 1);
    }
    else {
      it[1] = this->decimal_point_;
      __s = (byte *)(it + 2);
      iVar18 = this->num_digits_;
    }
    pcVar6 = this->digits_;
    for (lVar16 = 1; iVar18 != lVar16; lVar16 = lVar16 + 1) {
      *__s = pcVar6[lVar16];
      __s = __s + 1;
    }
    pbVar8 = __s;
    if (bVar10 != 0) {
      pbVar8 = __s + uVar4;
      switchD_014c3389::default(__s,0x30,(ulong)uVar4);
    }
    *pbVar8 = ((*(uint *)&(this->specs_).field_0x4 >> 0x18 & 1) == 0) << 5 | 0x45;
    pcVar6 = write_exponent<char,char*>(uVar13 - 1,(char *)(pbVar8 + 1));
    return pcVar6;
  }
  if (this->exp_ < 0) {
    if ((int)uVar13 < 1) {
      *it = '0';
      uVar14 = -uVar13;
      uVar4 = this->num_digits_;
      if (uVar4 == 0) {
        uVar1 = (this->specs_).precision;
        uVar3 = uVar14;
        if (SBORROW4(uVar1,uVar14) != (int)(uVar1 + uVar13) < 0) {
          uVar3 = uVar1;
        }
        if (-1 < (int)uVar1) {
          uVar14 = uVar3;
        }
      }
      if ((0 < (int)uVar4) && ((*(uint *)&(this->specs_).field_0x4 & 0x20000000) == 0)) {
        do {
          if (this->digits_[(ulong)uVar4 - 1] != '0') goto LAB_01282f14;
          bVar2 = 1 < (int)uVar4;
          uVar4 = uVar4 - 1;
        } while (bVar2);
        uVar4 = 0;
      }
      if (uVar4 == 0 && uVar14 == 0) {
        return it + 1;
      }
LAB_01282f14:
      it[1] = this->decimal_point_;
      pcVar9 = it + 2;
      pcVar6 = pcVar9;
      if (0 < (int)uVar14) {
        pcVar6 = pcVar9 + uVar14;
        switchD_014c3389::default(pcVar9,0x30,(ulong)uVar14);
      }
      pcVar9 = this->digits_;
      for (lVar16 = 0; (int)uVar4 != lVar16; lVar16 = lVar16 + 1) {
        pcVar6[lVar16] = pcVar9[lVar16];
      }
      return pcVar6 + lVar16;
    }
    uVar15 = (ulong)uVar13;
    if (uVar13 < 4 || (uVar4 & 0xff0000) == 0) {
      pcVar6 = this->digits_;
      for (uVar7 = 0; uVar15 != uVar7; uVar7 = uVar7 + 1) {
        it[uVar7] = pcVar6[uVar7];
      }
      it = it + uVar7;
    }
    else {
      uVar7 = (ulong)uVar13 % 3;
      iVar18 = 0;
      if ((int)uVar7 == 0) {
        uVar7 = 3;
        iVar18 = 0;
      }
      for (; iVar18 < (int)uVar13; iVar18 = iVar18 + iVar12) {
        if (0 < iVar18) {
          *it = (this->specs_).field_0x6;
          it = it + 1;
        }
        pcVar6 = this->digits_;
        iVar12 = (int)uVar7;
        for (uVar17 = 0; uVar7 != uVar17; uVar17 = uVar17 + 1) {
          it[uVar17] = pcVar6[uVar17 + (long)iVar18];
        }
        it = it + uVar17;
        uVar7 = 3;
      }
    }
    if (((this->specs_).field_0x7 & 0x20) == 0) {
      uVar4 = this->num_digits_;
      lVar16 = (long)(int)uVar4;
      pcVar6 = this->digits_;
      uVar14 = uVar13;
      if ((int)uVar4 < (int)uVar13) {
        uVar14 = uVar4;
      }
      do {
        if (lVar16 <= (long)uVar15) {
LAB_01282fe6:
          if (uVar14 != uVar13) {
            *it = this->decimal_point_;
            it = it + 1;
            pcVar6 = this->digits_;
          }
          for (lVar16 = 0; (long)(int)uVar14 - uVar15 != lVar16; lVar16 = lVar16 + 1) {
            it[lVar16] = pcVar6[lVar16 + uVar15];
          }
          return it + lVar16;
        }
        if (pcVar6[lVar16 + -1] != '0') {
          uVar14 = (uint)lVar16;
          goto LAB_01282fe6;
        }
        lVar16 = lVar16 + -1;
      } while( true );
    }
    *it = this->decimal_point_;
    pcVar6 = this->digits_;
    iVar18 = this->num_digits_;
    for (; it = it + 1, (long)iVar18 != uVar15; uVar15 = uVar15 + 1) {
      *it = pcVar6[uVar15];
    }
    iVar18 = (this->specs_).precision;
    iVar12 = this->num_digits_;
    uVar4 = iVar18 - iVar12;
    if (uVar4 == 0 || iVar18 < iVar12) {
      return it;
    }
    if (uVar4 == 0 || iVar18 < iVar12) {
      return it;
    }
  }
  else {
    if ((int)uVar13 < 4 || (uVar4 & 0xff0000) == 0) {
      pcVar6 = this->digits_;
      for (lVar16 = 0; iVar18 != lVar16; lVar16 = lVar16 + 1) {
        *it = pcVar6[lVar16];
        it = it + 1;
      }
      uVar4 = uVar13 - this->num_digits_;
      pcVar6 = it;
      if (uVar4 != 0 && this->num_digits_ <= (int)uVar13) {
        pcVar6 = it + uVar4;
        switchD_014c3389::default(it,0x30,(ulong)uVar4);
      }
    }
    else {
      uVar15 = (ulong)uVar13 % 3;
      iVar18 = 0;
      if ((int)uVar15 == 0) {
        uVar15 = 3;
        iVar18 = 0;
      }
      for (; iVar12 = (int)uVar15, pcVar6 = it, iVar18 < (int)uVar13; iVar18 = iVar18 + iVar12) {
        if (0 < iVar18) {
          *it = (this->specs_).field_0x6;
          it = it + 1;
        }
        iVar5 = this->num_digits_ - iVar18;
        pcVar6 = it;
        if (iVar5 == 0 || this->num_digits_ < iVar18) {
LAB_01282d57:
          it = pcVar6 + uVar15;
          switchD_014c3389::default(pcVar6,0x30,uVar15);
        }
        else {
          iVar11 = iVar5;
          if (iVar12 < iVar5) {
            iVar11 = iVar12;
          }
          pcVar6 = this->digits_;
          for (lVar16 = 0; iVar11 != lVar16; lVar16 = lVar16 + 1) {
            *it = pcVar6[lVar16 + iVar18];
            it = it + 1;
          }
          if ((iVar5 < iVar12) && (iVar12 - iVar11 != 0 && iVar11 <= iVar12)) {
            uVar15 = (ulong)(uint)(iVar12 - iVar11);
            pcVar6 = it;
            goto LAB_01282d57;
          }
        }
        uVar15 = 3;
      }
    }
    if (((this->specs_).field_0x7 & 0x20) == 0) {
      return pcVar6;
    }
    it = pcVar6 + 1;
    *pcVar6 = this->decimal_point_;
    iVar18 = (this->specs_).precision;
    uVar4 = iVar18 - uVar13;
    if (uVar4 == 0 || iVar18 < (int)uVar13) {
      if ((this->specs_).field_0x4 == '\x02') {
        return it;
      }
      pcVar6[1] = '0';
      return pcVar6 + 2;
    }
  }
  switchD_014c3389::default(it,0x30,(ulong)uVar4);
  return it + uVar4;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          if (i < num_digits_) {
            // we still need to write digits
            int write_count = std::min<int>(num_digits_ - i, digit_count);
            it = copy_str<Char>(digits_ + i, digits_ + i + write_count, it);
            if (write_count < digit_count) {
              // write any trailing zeros that belong to this batch
              it = std::fill_n(it, digit_count - write_count, static_cast<Char>('0'));
            }
          } else {
            // we only need to write trailing zeros
            it = std::fill_n(it, digit_count, static_cast<Char>('0'));
          }
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + num_digits_, it);
        it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      }
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          it = copy_str<Char>(digits_ + i, digits_ + i + digit_count, it);
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + full_exp, it);
      }
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (num_digits_ == 0 && specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }